

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_relax_snode.c
# Opt level: O2

void heap_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  int_t *addr;
  int *addr_00;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char msg [256];
  int iVar2;
  
  addr = intMalloc(n * 3 + 2);
  if (addr == (int_t *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for iwork[]",0x43,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/heap_relax_snode.c"
           );
    superlu_abort_and_exit(msg);
  }
  lVar9 = (long)n;
  addr_00 = TreePostorder(n,et);
  for (lVar4 = 0; lVar4 <= lVar9; lVar4 = lVar4 + 1) {
    addr[lVar9 + (long)addr_00[lVar4] + 1] = (int_t)lVar4;
  }
  uVar7 = 0;
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    addr[addr_00[uVar7]] = addr_00[et[uVar7]];
    addr[lVar9 * 2 + uVar7 + 2] = et[uVar7];
  }
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    et[uVar7] = addr[uVar7];
  }
  ifill(relax_end,n,-1);
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    descendants[uVar7] = 0;
  }
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = et[uVar7];
    if (iVar1 != n) {
      descendants[iVar1] = descendants[uVar7] + descendants[iVar1] + 1;
    }
  }
  iVar1 = 0;
  do {
    if (n <= iVar1) {
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        et[uVar7] = addr[lVar9 * 2 + uVar7 + 2];
      }
      superlu_free(addr_00);
      superlu_free(addr);
      return;
    }
    lVar5 = (long)iVar1;
    lVar4 = lVar5;
    iVar6 = iVar1;
    do {
      iVar2 = iVar6;
      iVar6 = et[lVar4];
      if (iVar6 == n) break;
      lVar4 = (long)iVar6;
    } while (descendants[lVar4] < relax_columns);
    lVar3 = (long)iVar2;
    iVar6 = n;
    for (lVar4 = lVar5; lVar4 <= lVar3; lVar4 = lVar4 + 1) {
      if (addr[lVar9 + lVar4 + 1] <= iVar6) {
        iVar6 = addr[lVar9 + lVar4 + 1];
      }
    }
    if (addr[lVar9 + lVar3 + 1] - iVar6 == iVar2 - iVar1) {
      relax_end[iVar6] = addr[lVar9 + lVar3 + 1];
    }
    else {
      for (; lVar5 <= lVar3; lVar5 = lVar5 + 1) {
        if (descendants[lVar5] == 0) {
          relax_end[addr[lVar9 + lVar5 + 1]] = addr[lVar9 + lVar5 + 1];
        }
      }
    }
    do {
      lVar3 = lVar3 + 1;
      iVar1 = iVar2 + 1;
      if (descendants[lVar3] == 0) break;
      iVar2 = iVar1;
    } while (lVar3 < lVar9);
  } while( true );
}

Assistant:

void
heap_relax_snode (
	     const     int n,
	     int       *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{
    register int i, j, k, l, parent;
    register int snode_start;	/* beginning of a snode */
    int *et_save, *post, *inv_post, *iwork;
#if ( PRNTlevel>=1 )
    int nsuper_et = 0, nsuper_et_post = 0;
#endif

    /* The etree may not be postordered, but is heap ordered. */

    iwork = (int*) intMalloc(3*n+2); 
    if ( !iwork ) ABORT("SUPERLU_MALLOC fails for iwork[]");
    inv_post = iwork + n+1;
    et_save = inv_post + n+1;

    /* Post order etree */
    post = (int *) TreePostorder(n, et);
    for (i = 0; i < n+1; ++i) inv_post[post[i]] = i;

    /* Renumber etree in postorder */
    for (i = 0; i < n; ++i) {
        iwork[post[i]] = post[et[i]];
	et_save[i] = et[i]; /* Save the original etree */
    }
    for (i = 0; i < n; ++i) et[i] = iwork[i];

    /* Compute the number of descendants of each node in the etree */
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode in postordered etree; j is the last column. */
#if ( PRNTlevel>=1 )
	++nsuper_et_post;
#endif
	k = n;
	for (i = snode_start; i <= j; ++i)
	    k = SUPERLU_MIN(k, inv_post[i]);
	l = inv_post[j];
	if ( (l - k) == (j - snode_start) ) {
	    /* It's also a supernode in the original etree */
	    relax_end[k] = l;		/* Last column is recorded */
#if ( PRNTlevel>=1 )
	    ++nsuper_et;
#endif
	} else {
	    for (i = snode_start; i <= j; ++i) {
	        l = inv_post[i];
	        if ( descendants[i] == 0 ) {
		    relax_end[l] = l;
#if ( PRNTlevel>=1 )
		    ++nsuper_et;
#endif
		}
	    }
	}
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

#if ( PRNTlevel>=1 )
    printf(".. heap_snode_relax:\n"
	   "\tNo of relaxed snodes in postordered etree:\t%d\n"
	   "\tNo of relaxed snodes in original etree:\t%d\n",
	   nsuper_et_post, nsuper_et);
#endif

    /* Recover the original etree */
    for (i = 0; i < n; ++i) et[i] = et_save[i];

    SUPERLU_FREE(post);
    SUPERLU_FREE(iwork);
}